

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void msd_lsd_adaptive<12u>(Cacheblock<12U> *cache,size_t N,size_t depth)

{
  value_type_conflict2 vVar1;
  size_t sVar2;
  int iVar3;
  reference pvVar4;
  void *__src;
  undefined8 *puVar5;
  pointer __s1;
  pointer __s2;
  Cacheblock<12U> *pCVar6;
  ulong uStack_80070;
  size_t i_3;
  size_t cnt;
  size_t start;
  ulong uStack_80050;
  uint16_t bucket_1;
  size_t i_2;
  size_t i_1;
  Cacheblock<12U> *sorted;
  ulong uStack_80030;
  uint16_t bucket;
  size_t i;
  size_t bucketsize [65536];
  int byte;
  size_t depth_local;
  size_t N_local;
  Cacheblock<12U> *cache_local;
  
  if (N < 0x10000) {
    msd_lsd<12u>(cache,N,depth);
  }
  else {
    fill_cache<12u>(cache,N,depth);
    for (bucketsize[0xffff]._4_4_ = 0xb; 0 < bucketsize[0xffff]._4_4_;
        bucketsize[0xffff]._4_4_ = bucketsize[0xffff]._4_4_ + -2) {
      memset(&i,0,0x80000);
      for (uStack_80030 = 0; uStack_80030 < N; uStack_80030 = uStack_80030 + 1) {
        pvVar4 = std::array<unsigned_char,_12UL>::operator[]
                           (&cache[uStack_80030].chars,(long)(bucketsize[0xffff]._4_4_ + -1));
        vVar1 = *pvVar4;
        pvVar4 = std::array<unsigned_char,_12UL>::operator[]
                           (&cache[uStack_80030].chars,(long)bucketsize[0xffff]._4_4_);
        bucketsize[(ulong)CONCAT11(vVar1,*pvVar4) - 1] =
             bucketsize[(ulong)CONCAT11(vVar1,*pvVar4) - 1] + 1;
      }
      __src = malloc(N * 0x18);
      msd_lsd_adaptive<12U>::bucketindex[0] = 0;
      for (i_2 = 1; i_2 < 0x10000; i_2 = i_2 + 1) {
        msd_lsd_adaptive<12U>::bucketindex[i_2] =
             msd_lsd_adaptive<12U>::bucketindex[i_2 - 1] + bucketsize[i_2 - 2];
      }
      for (uStack_80050 = 0; uStack_80050 < N; uStack_80050 = uStack_80050 + 1) {
        pvVar4 = std::array<unsigned_char,_12UL>::operator[]
                           (&cache[uStack_80050].chars,(long)(bucketsize[0xffff]._4_4_ + -1));
        vVar1 = *pvVar4;
        pvVar4 = std::array<unsigned_char,_12UL>::operator[]
                           (&cache[uStack_80050].chars,(long)bucketsize[0xffff]._4_4_);
        sVar2 = msd_lsd_adaptive<12U>::bucketindex[CONCAT11(vVar1,*pvVar4)];
        msd_lsd_adaptive<12U>::bucketindex[CONCAT11(vVar1,*pvVar4)] = sVar2 + 1;
        puVar5 = (undefined8 *)((long)__src + sVar2 * 0x18);
        pCVar6 = cache + uStack_80050;
        *puVar5 = *(undefined8 *)(pCVar6->chars)._M_elems;
        puVar5[1] = *(undefined8 *)((pCVar6->chars)._M_elems + 8);
        puVar5[2] = pCVar6->ptr;
      }
      memcpy(cache,__src,N * 0x18);
      free(__src);
    }
    cnt = 0;
    i_3 = 1;
    for (uStack_80070 = 0; uStack_80070 < N - 1; uStack_80070 = uStack_80070 + 1) {
      __s1 = std::array<unsigned_char,_12UL>::data(&cache[uStack_80070].chars);
      __s2 = std::array<unsigned_char,_12UL>::data(&cache[uStack_80070 + 1].chars);
      iVar3 = memcmp(__s1,__s2,0xc);
      if (iVar3 == 0) {
        i_3 = i_3 + 1;
      }
      else {
        if (1 < i_3) {
          pvVar4 = std::array<unsigned_char,_12UL>::operator[](&cache[cnt].chars,0xb);
          if (*pvVar4 != '\0') {
            msd_lsd_adaptive<12u>(cache + cnt,i_3,depth + 0xc);
          }
        }
        i_3 = 1;
        cnt = uStack_80070 + 1;
      }
    }
    if (1 < i_3) {
      pvVar4 = std::array<unsigned_char,_12UL>::operator[](&cache[cnt].chars,0xb);
      if (*pvVar4 != '\0') {
        msd_lsd_adaptive<12u>(cache + cnt,i_3,depth + 0xc);
      }
    }
  }
  return;
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}